

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

string * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>,FastPForLib::VariableByte>::
name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  ostringstream convert;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_(&local_1b0,(void *)((long)this + 8));
  poVar1 = std::operator<<((ostream *)local_190,(string *)&local_1b0);
  poVar1 = std::operator<<(poVar1,"+");
  VariableByte::name_abi_cxx11_(&local_1d0,(VariableByte *)((long)this + 0x78));
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    std::ostringstream convert;
    convert << codec1.name() << "+" << codec2.name();
    return convert.str();
  }